

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double find_split_std_gain_weighted<double,double>
                 (double *x,size_t n,double *sd_arr,GainCriterion criterion,double min_gain,
                 double *split_point,double *w,size_t *sorted_ix)

{
  double dVar1;
  int in_ECX;
  double *in_RDX;
  size_t in_RSI;
  double *in_RDI;
  double *in_R8;
  double *in_R9;
  double in_XMM0_Qa;
  double dVar2;
  size_t *in_stack_00000008;
  size_t row;
  size_t best_ix;
  double currw;
  double w_this;
  double this_gain;
  double this_sd;
  double best_gain;
  double mean_prev;
  double running_ssq;
  double running_mean;
  double full_sd;
  double cumw;
  double local_a8;
  double in_stack_ffffffffffffff60;
  double dVar3;
  double local_88;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_40;
  double *local_38;
  double *local_30;
  double local_28;
  int local_1c;
  double *local_18;
  size_t local_10;
  double *local_8;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_XMM0_Qa;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  dVar2 = calc_sd_right_to_left_weighted<double,double>
                    (in_RDI,in_RSI,in_RDX,in_R9,&local_40,in_stack_00000008);
  local_50 = 0.0;
  local_58 = 0.0;
  local_68 = -INFINITY;
  local_88 = 0.0;
  local_60 = local_8[*in_stack_00000008];
  for (dVar3 = 0.0; (ulong)dVar3 < local_10 - 1; dVar3 = (double)((long)dVar3 + 1)) {
    dVar1 = local_38[in_stack_00000008[(long)dVar3]];
    local_88 = dVar1 + local_88;
    local_50 = (dVar1 * (local_8[in_stack_00000008[(long)dVar3]] - local_50)) / local_88 + local_50;
    local_58 = dVar1 * (local_8[in_stack_00000008[(long)dVar3]] - local_50) *
                       (local_8[in_stack_00000008[(long)dVar3]] - local_60) + local_58;
    if ((local_8[in_stack_00000008[(long)dVar3]] != local_8[in_stack_00000008[(long)dVar3 + 1]]) ||
       (NAN(local_8[in_stack_00000008[(long)dVar3]]) ||
        NAN(local_8[in_stack_00000008[(long)dVar3 + 1]]))) {
      if (dVar3 == 0.0) {
        in_stack_ffffffffffffff60 = 0.0;
      }
      else {
        in_stack_ffffffffffffff60 = SQRT(local_58 / local_88);
      }
      if (local_1c == 2) {
        local_a8 = -(1.0 / dVar2) *
                   ((local_88 / local_40) * in_stack_ffffffffffffff60 +
                   ((local_40 - local_88) / local_40) * local_18[(long)dVar3 + 1]) + 1.0;
      }
      else {
        local_a8 = 1.0 - (in_stack_ffffffffffffff60 + local_18[(long)dVar3 + 1]) / (dVar2 * 2.0);
      }
      if ((local_68 < local_a8) && (local_28 < local_a8)) {
        local_68 = local_a8;
      }
    }
    local_60 = local_50;
  }
  if (-INFINITY < local_68) {
    dVar3 = midpoint<double>(dVar3,in_stack_ffffffffffffff60);
    *local_30 = dVar3;
  }
  return local_68;
}

Assistant:

double find_split_std_gain_weighted(real_t *restrict x, size_t n, double *restrict sd_arr,
                                    GainCriterion criterion, double min_gain, double &restrict split_point,
                                    double *restrict w, size_t *restrict sorted_ix)
{
    ldouble_safe cumw;
    double full_sd = calc_sd_right_to_left_weighted(x, n, sd_arr, w, cumw, sorted_ix);
    ldouble_safe running_mean = 0;
    ldouble_safe running_ssq = 0;
    ldouble_safe mean_prev = x[sorted_ix[0]];
    double best_gain = -HUGE_VAL;
    double this_sd, this_gain;
    double w_this;
    ldouble_safe currw = 0;
    size_t best_ix = 0;

    for (size_t row = 0; row < n-1; row++)
    {
        w_this = w[sorted_ix[row]];
        currw += w_this;
        running_mean   += w_this * (x[sorted_ix[row]] - running_mean) / currw;
        running_ssq    += w_this * ((x[sorted_ix[row]] - running_mean) * (x[sorted_ix[row]] - mean_prev));
        mean_prev       =  running_mean;
        if (x[sorted_ix[row]] == x[sorted_ix[row+1]])
            continue;

        this_sd = (row == 0)? 0. : std::sqrt(running_ssq / currw);
        this_gain = (criterion == Pooled)?
                    pooled_gain(full_sd, cumw, this_sd, sd_arr[row+1], currw, cumw-currw)
                        :
                    sd_gain(full_sd, this_sd, sd_arr[row+1]);
        if (this_gain > best_gain && this_gain > min_gain)
        {
            best_gain = this_gain;
            best_ix = row;
        }
    }

    if (best_gain > -HUGE_VAL)
        split_point = midpoint(x[sorted_ix[best_ix]], x[sorted_ix[best_ix+1]]);

    return best_gain;
}